

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context_id.cpp
# Opt level: O0

void __thiscall MeCab::ContextID::add(ContextID *this,char *l,char *r)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this_00;
  char *in_RDX;
  char *in_RSI;
  long in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_int>_>::value,_pair<iterator,_bool>_>
  _Var1;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *in_stack_fffffffffffffec8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *in_stack_fffffffffffffed0;
  allocator local_d1;
  string local_d0 [72];
  _Base_ptr local_88;
  undefined1 local_80;
  undefined4 local_78;
  allocator local_61;
  string local_60 [72];
  char *local_18;
  
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,in_RSI,&local_61);
  local_78 = 1;
  std::make_pair<std::__cxx11::string,int>
            (&in_stack_fffffffffffffec8->first,
             (int *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
  _Var1 = std::
          map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
          ::insert<std::pair<std::__cxx11::string,int>>
                    (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  local_88 = (_Base_ptr)_Var1.first._M_node;
  local_80 = _Var1.second;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  ~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
         *)0x164975);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  this_00 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             *)(in_RDI + 0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,local_18,&local_d1);
  std::make_pair<std::__cxx11::string,int>
            (&in_stack_fffffffffffffec8->first,
             (int *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
  std::
  map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
  ::insert<std::pair<std::__cxx11::string,int>>(this_00,in_stack_fffffffffffffec8);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  ~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
         *)0x164a2c);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  return;
}

Assistant:

void ContextID::add(const char *l, const char *r) {
  left_.insert(std::make_pair(std::string(l), 1));
  right_.insert(std::make_pair(std::string(r), 1));
}